

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm_cpu_update_virq_arm(ARMCPU *cpu)

{
  bool local_22;
  _Bool new_state;
  CPUState *cs;
  CPUARMState *env;
  ARMCPU *cpu_local;
  
  local_22 = true;
  if (((cpu->env).cp15.hcr_el2 & 0x80) == 0) {
    local_22 = ((cpu->env).irq_line_state & 0x40) != 0;
  }
  if (local_22 != (((cpu->parent_obj).interrupt_request & 0x40) != 0)) {
    if (local_22 == false) {
      cpu_reset_interrupt(&cpu->parent_obj,0x40);
    }
    else {
      cpu_interrupt(&cpu->parent_obj,0x40);
    }
  }
  return;
}

Assistant:

void arm_cpu_update_virq(ARMCPU *cpu)
{
    /*
     * Update the interrupt level for VIRQ, which is the logical OR of
     * the HCR_EL2.VI bit and the input line level from the GIC.
     */
    CPUARMState *env = &cpu->env;
    CPUState *cs = CPU(cpu);

    bool new_state = (env->cp15.hcr_el2 & HCR_VI) ||
        (env->irq_line_state & CPU_INTERRUPT_VIRQ);

    if (new_state != ((cs->interrupt_request & CPU_INTERRUPT_VIRQ) != 0)) {
        if (new_state) {
            cpu_interrupt(cs, CPU_INTERRUPT_VIRQ);
        } else {
            cpu_reset_interrupt(cs, CPU_INTERRUPT_VIRQ);
        }
    }
}